

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O3

var __thiscall
cs_impl::runtime_cs_ext::wait_until_impl
          (runtime_cs_ext *this,size_t mill_sec,callable *func,vector *args)

{
  future_status fVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Result<cs_impl::any> *this_00;
  long lVar3;
  long *plVar4;
  _State_baseV2 *__tmp;
  shared_ptr<std::__future_base::_State_baseV2> __state;
  future<cs_impl::any> future;
  __state_type local_98;
  long *local_80;
  uint *local_78;
  long local_70;
  uint local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  __basic_future<cs_impl::any> local_58;
  size_t local_48;
  _func_int **local_40 [2];
  
  local_98.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  local_98.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_48 = mill_sec;
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x58);
  p_Var2->_M_use_count = 1;
  p_Var2->_M_weak_count = 1;
  p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00260ba8;
  p_Var2[1]._M_use_count = 0;
  p_Var2[1]._M_weak_count = 0;
  *(undefined4 *)&p_Var2[2]._vptr__Sp_counted_base = 0;
  *(undefined1 *)((long)&p_Var2[2]._vptr__Sp_counted_base + 4) = 0;
  p_Var2[2]._M_use_count = 0;
  p_Var2[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var2[3]._M_use_count = 0;
  p_Var2[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_00260bf8;
  this_00 = (_Result<cs_impl::any> *)operator_new(0x20);
  std::__future_base::_Result<cs_impl::any>::_Result(this_00);
  p_Var2[4]._vptr__Sp_counted_base = (_func_int **)this_00;
  *(callable **)&p_Var2[4]._M_use_count = func;
  p_Var2[5]._vptr__Sp_counted_base = (_func_int **)args;
  local_40[0] = (_func_int **)0x0;
  local_80 = (long *)operator_new(0x20);
  *local_80 = (long)&PTR___State_00260c50;
  local_80[1] = (long)(p_Var2 + 1);
  local_80[2] = (long)std::__future_base::
                      _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/instance/type_ext.cpp:1390:65)>_>,_cs_impl::any>
                      ::_M_run;
  local_80[3] = 0;
  std::thread::_M_start_thread(local_40,&local_80,0);
  if (local_80 != (long *)0x0) {
    (**(code **)(*local_80 + 8))();
  }
  if (p_Var2[3]._vptr__Sp_counted_base == (_func_int **)0x0) {
    p_Var2[3]._vptr__Sp_counted_base = local_40[0];
    local_98.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)(p_Var2 + 1);
    local_98.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var2;
    std::__basic_future<cs_impl::any>::__basic_future(&local_58,&local_98);
    if (local_98.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    lVar3 = std::chrono::_V2::system_clock::now();
    local_98.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)(local_48 * 1000000 + lVar3);
    if (local_58._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (_State_baseV2 *)0x0) {
      std::__throw_future_error(3);
    }
    else {
      fVar1 = std::__future_base::_State_baseV2::
              wait_until<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                        (local_58._M_state.
                         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr,(time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                  *)&local_98);
      if (fVar1 == ready) {
        std::future<cs_impl::any>::get((future<cs_impl::any> *)this);
        if (local_58._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_58._M_state.
                     super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        return (var)(proxy *)this;
      }
    }
    plVar4 = (long *)__cxa_allocate_exception(0x20);
    local_78 = &local_68;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"Target function deferred or timeout.","");
    *plVar4 = (long)(plVar4 + 2);
    if (local_78 == &local_68) {
      *(uint *)(plVar4 + 2) = local_68;
      *(undefined4 *)((long)plVar4 + 0x14) = uStack_64;
      *(undefined4 *)(plVar4 + 3) = uStack_60;
      *(undefined4 *)((long)plVar4 + 0x1c) = uStack_5c;
    }
    else {
      *plVar4 = (long)local_78;
      plVar4[2] = CONCAT44(uStack_64,local_68);
    }
    plVar4[1] = local_70;
    local_70 = 0;
    local_68 = local_68 & 0xffffff00;
    local_78 = &local_68;
    __cxa_throw(plVar4,&cs::lang_error::typeinfo,cs::lang_error::~lang_error);
  }
  std::terminate();
}

Assistant:

cs::var wait_until_impl(std::size_t mill_sec, const cs::callable &func, cs::vector &args)
		{
			std::future<cs::var> future = std::async(std::launch::async, [&func, &args]() -> var {
				return wait_worker(func, args);
			});
			if (future.wait_until(std::chrono::system_clock::now() + std::chrono::milliseconds(mill_sec)) !=
			        std::future_status::ready)
				throw cs::lang_error("Target function deferred or timeout.");
			else
				return future.get();
		}